

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvamemtiming.c
# Opt level: O0

void signal_handler(int sig)

{
  int sig_local;
  
  if (sig == 0xb) {
    fprintf(_stderr,"Received a sigsegv. Exit nicely...\n");
  }
  else {
    fprintf(_stderr,"Received a termination request. Exit nicely...\n");
  }
  system("killall X");
  exit(99);
}

Assistant:

void signal_handler(int sig)
{
	if (sig == SIGSEGV)
		fprintf(stderr, "Received a sigsegv. Exit nicely...\n");
	else
		fprintf(stderr, "Received a termination request. Exit nicely...\n");

	system("killall X");
	exit(99);
}